

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printVRegOperand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint RegNo;
  cs_ac_type cVar3;
  arm64_reg aVar4;
  MCOperand *op;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint8_t access;
  uint Reg;
  MCOperand *Op;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  RegNo = MCOperand_getReg(op);
  getRegisterName(RegNo,2);
  SStream_concat0(in_RDX,in_stack_ffffffffffffffc8);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    MCInst_getOpcode(in_RDI);
    cVar3 = get_op_access((cs_struct *)CONCAT44(RegNo,in_stack_ffffffffffffffd8),
                          (uint)((ulong)in_RDX >> 0x20),(uint)in_RDX);
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar3;
    in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    aVar4 = AArch64_map_vregister(RegNo);
    *(arm64_reg *)
     (in_RDI->flat_insn->detail->groups +
     (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = aVar4;
    pcVar2 = in_RDI->flat_insn->detail;
    (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
  }
  return;
}

Assistant:

static void printVRegOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	//assert(Op.isReg() && "Non-register vreg operand!");
	unsigned Reg = MCOperand_getReg(Op);
	SStream_concat0(O, getRegisterName(Reg, AArch64_vreg));
	if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
		uint8_t access;
		access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
		MI->ac_idx++;
#endif
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = AArch64_map_vregister(Reg);
		MI->flat_insn->detail->arm64.op_count++;
	}
}